

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O1

Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
* __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
::operator*=(Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
             *this,uint v)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  long *plVar4;
  node_ptr next;
  _Rb_tree_node_base *p_Var5;
  
  uVar1 = this->operators_->characteristic_;
  if (uVar1 <= v) {
    v = v % uVar1;
  }
  if (v != 1) {
    if (v == 0) {
      for (p_Var5 = (this->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(this->column_)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        pvVar2 = *(void **)(p_Var5 + 1);
        if (((this->super_Row_access_option).rows_ != (Row_container *)0x0) &&
           (lVar3 = *(long *)((long)pvVar2 + 8), lVar3 != 0)) {
          plVar4 = *(long **)((long)pvVar2 + 0x10);
          *plVar4 = lVar3;
          *(long **)(lVar3 + 8) = plVar4;
          *(undefined8 *)((long)pvVar2 + 8) = 0;
          *(undefined8 *)((long)pvVar2 + 0x10) = 0;
        }
        if (pvVar2 != (void *)0x0) {
          lVar3 = *(long *)((long)pvVar2 + 8);
          if (lVar3 != 0) {
            plVar4 = *(long **)((long)pvVar2 + 0x10);
            *plVar4 = lVar3;
            *(long **)(lVar3 + 8) = plVar4;
            *(undefined8 *)((long)pvVar2 + 8) = 0;
            *(undefined8 *)((long)pvVar2 + 0x10) = 0;
          }
          operator_delete(pvVar2,0x20);
        }
      }
      std::
      _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>_>
      ::clear(&(this->column_)._M_t);
    }
    else {
      for (p_Var5 = (this->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != &(this->column_)._M_t._M_impl.super__Rb_tree_header;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (this->operators_,(Element *)(*(long *)(p_Var5 + 1) + 4),v);
      }
    }
  }
  return this;
}

Assistant:

inline Set_column<Master_matrix>& Set_column<Master_matrix>::operator*=(unsigned int v)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    if (v % 2 == 0) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
    }
  } else {
    Field_element val = operators_->get_value(v);

    if (val == Field_operators::get_additive_identity()) {
      if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
        throw std::invalid_argument("A chain column should not be multiplied by 0.");
      } else {
        clear();
      }
      return *this;
    }

    if (val == Field_operators::get_multiplicative_identity()) return *this;

    for (Entry* entry : column_) {
      operators_->multiply_inplace(entry->get_element(), val);
      if constexpr (Master_matrix::Option_list::has_row_access) RA_opt::update_entry(*entry);
    }
  }

  return *this;
}